

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

int secp256k1_jacobi32_maybe_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 g;
  int local_ac;
  int local_a8;
  secp256k1_modinv32_trans2x2 local_a0;
  undefined8 local_90;
  secp256k1_modinv32_signed30 local_88;
  int iStack_5c;
  secp256k1_modinv32_signed30 local_58;
  
  local_88.v[8] = (modinfo->modulus).v[8];
  local_88.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_88.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_88.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_88.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_58.v[8] = x->v[8];
  local_58.v._0_8_ = *(undefined8 *)x->v;
  local_58.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_58.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_58.v._24_8_ = *(undefined8 *)(x->v + 6);
  uVar10 = 9;
  iVar14 = -1;
  iVar4 = 0;
  uVar15 = 0;
  do {
    uVar12 = 0;
    if ((local_58.v[0] | 0xc0000000U) != 0) {
      for (; ((local_58.v[0] | 0xc0000000U) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
      }
    }
    local_a0.u = 1 << ((byte)uVar12 & 0x1f);
    iVar14 = iVar14 - uVar12;
    uVar15 = ((uint)local_88.v[0] >> 2 ^ (uint)local_88.v[0] >> 1) & uVar12 ^ uVar15;
    if (uVar12 == 0x1e) {
      local_ac = 1;
      local_a0.q = 0;
      local_a0.v = 0;
    }
    else {
      uVar7 = local_88.v[1] << 0x1e | local_88.v[0];
      uVar11 = (uint)(local_58.v[1] << 0x1e | local_58.v[0]) >> ((byte)uVar12 & 0x1f);
      iVar8 = 0x1e - uVar12;
      local_ac = 1;
      local_a0.v = 0;
      local_a0.q = 0;
      do {
        iVar16 = local_a0.u;
        uVar12 = uVar11;
        iVar13 = local_a0.v;
        if (iVar14 < 0) {
          iVar14 = -iVar14;
          uVar15 = uVar15 ^ (uVar7 & uVar11) >> 1;
          iVar16 = local_a0.q;
          uVar12 = uVar7;
          uVar7 = uVar11;
          local_a0.q = local_a0.u;
          iVar13 = local_ac;
          local_ac = local_a0.v;
        }
        iVar2 = iVar14 + 1;
        if (iVar8 <= iVar14 + 1) {
          iVar2 = iVar8;
        }
        uVar5 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar7 >> 1 & 0x7f] * (char)uVar12) <<
                (-(char)iVar2 & 0x1fU)) >> (-(char)iVar2 & 0x1fU);
        uVar12 = uVar5 * uVar7 + uVar12;
        local_a0.q = uVar5 * iVar16 + local_a0.q;
        uVar11 = -1 << ((byte)iVar8 & 0x1f) | uVar12;
        uVar1 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        bVar6 = (byte)uVar1;
        uVar11 = uVar12 >> (bVar6 & 0x1f);
        local_a0.u = iVar16 << (bVar6 & 0x1f);
        local_a0.v = iVar13 << (bVar6 & 0x1f);
        local_ac = uVar5 * iVar13 + local_ac;
        iVar14 = iVar14 - uVar1;
        uVar15 = uVar15 ^ (uVar7 >> 2 ^ uVar7 >> 1) & uVar1;
        iVar8 = iVar8 - uVar1;
      } while (iVar8 != 0);
    }
    uVar12 = (uint)uVar10;
    local_a0.r = local_ac;
    local_90 = uVar10;
    secp256k1_modinv32_update_fg_30_var(uVar12,&local_88,&local_58,&local_a0);
    if (local_88.v[0] == 1) {
      if (1 < (int)uVar12) {
        uVar7 = 0;
        uVar9 = 1;
        do {
          uVar7 = uVar7 | local_88.v[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
        if (uVar7 != 0) goto LAB_0015f5e0;
      }
      local_a8 = 1 - (uVar15 * 2 & 2);
      bVar3 = false;
    }
    else {
LAB_0015f5e0:
      uVar7 = uVar12 - 1;
      if (((int)(uVar12 - 2) < 0 || *(int *)((long)&local_90 + (long)(int)uVar12 * 4 + 4) != 0) ||
          (&iStack_5c)[(int)uVar12] != 0) {
        uVar7 = uVar12;
      }
      bVar3 = true;
      uVar10 = (ulong)uVar7;
    }
    if (!bVar3) {
      return local_a8;
    }
    iVar4 = iVar4 + 1;
    if (iVar4 == 0x32) {
      return 0;
    }
  } while( true );
}

Assistant:

static int secp256k1_jacobi32_maybe_var(const secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 */
    int32_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0 && g.v[5] >= 0 && g.v[6] >= 0 && g.v[7] >= 0 && g.v[8] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4] | g.v[5] | g.v[6] | g.v[7] | g.v[8]) != 0);

    for (count = 0; count < JACOBI32_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 30 posdivsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_posdivsteps_30_var(eta, f.v[0] | ((uint32_t)f.v[1] << 30), g.v[0] | ((uint32_t)g.v[1] << 30), &t, &jac);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
#endif
        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. If f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
#endif
    }

    /* The loop failed to converge to f=g after 1500 iterations. Return 0, indicating unknown result. */
    return 0;
}